

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::ModelProto_SentencePiece::InternalSwap
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *other)

{
  InternalMetadata *this_00;
  float fVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  void *pvVar7;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar4 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar7 & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) {
      uVar2 = (this->_has_bits_).has_bits_[0];
      (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
      (other->_has_bits_).has_bits_[0] = uVar2;
      goto LAB_001b4b09;
    }
  }
  else if (((ulong)pvVar4 & 1) == 0) {
    google::protobuf::internal::InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>
              (&(other->super_MessageLite)._internal_metadata_);
    pvVar7 = this_00->ptr_;
  }
  if (((ulong)pvVar7 & 1) == 0) {
    pbVar6 = google::protobuf::internal::InternalMetadata::
             mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
  }
  else {
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (((ulong)pvVar7 & 0xfffffffffffffffe) + 8);
  }
  std::__cxx11::string::swap((string *)pbVar6);
  pvVar7 = (this->super_MessageLite)._internal_metadata_.ptr_;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  if (((ulong)pvVar7 & 1) != 0) {
    pvVar7 = *(void **)((ulong)pvVar7 & 0xfffffffffffffffe);
  }
LAB_001b4b09:
  if (((undefined8 *)(this->piece_).tagged_ptr_.ptr_ !=
       &google::protobuf::internal::fixed_address_empty_string) ||
     ((undefined8 *)(other->piece_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string)) {
    psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->piece_,pvVar7);
    google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->piece_,pvVar7);
    std::__cxx11::string::swap((string *)psVar5);
  }
  fVar1 = this->score_;
  this->score_ = other->score_;
  other->score_ = fVar1;
  iVar3 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar3;
  return;
}

Assistant:

void ModelProto_SentencePiece::InternalSwap(ModelProto_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(score_, other->score_);
  swap(type_, other->type_);
}